

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest14DistributionPoints_::
Section14ValidonlySomeReasonsTest19<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
TestBody(Section14ValidonlySomeReasonsTest19<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
         *this)

{
  undefined1 local_c8 [8];
  PkitsTestInfo info;
  char *crls [3];
  char *pcStack_28;
  char *certs [3];
  Section14ValidonlySomeReasonsTest19<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  certs[1] = "ValidonlySomeReasonsTest19EE";
  pcStack_28 = "TrustAnchorRootCertificate";
  certs[0] = "onlySomeReasonsCA4Cert";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  certs[2] = (char *)this;
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_c8);
  local_c8 = (undefined1  [8])0x6f35f7;
  info.time.year._0_1_ = 1;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,3ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)this,
             (char *(*) [3])&pcStack_28,
             (char *(*) [3])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_c8);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_c8);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest14DistributionPoints,
                     Section14ValidonlySomeReasonsTest19) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "onlySomeReasonsCA4Cert",
                               "ValidonlySomeReasonsTest19EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "onlySomeReasonsCA4compromiseCRL",
                              "onlySomeReasonsCA4otherreasonsCRL"};
  PkitsTestInfo info;
  info.test_number = "4.14.19";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}